

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O2

void make_engr_at(level *lev,int x,int y,char *s,long e_time,xchar e_type)

{
  int iVar1;
  size_t sVar2;
  engr *peVar3;
  char *pcVar4;
  size_t __n;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    sVar2 = strlen(s);
    __n = 0xff;
    if (sVar2 < 0xff) {
      __n = sVar2;
    }
    peVar3 = engr_at(lev,(xchar)x,(xchar)y);
    if (peVar3 != (engr *)0x0) {
      del_engr(lev,peVar3);
    }
    peVar3 = (engr *)calloc(1,__n + 0x29);
    peVar3->nxt_engr = lev->lev_engr;
    lev->lev_engr = peVar3;
    peVar3->engr_x = (xchar)x;
    peVar3->engr_y = (xchar)y;
    peVar3->engr_txt = (char *)(peVar3 + 1);
    strncpy((char *)(peVar3 + 1),s,__n);
    *(undefined1 *)((long)&peVar3[1].nxt_engr + __n) = 0;
    for (pcVar4 = (char *)((long)&peVar3[1].nxt_engr + 1);
        *(char *)&((engr *)(pcVar4 + -1))->nxt_engr == ' '; pcVar4 = pcVar4 + 1) {
      peVar3->engr_txt = pcVar4;
    }
    if ((in_mklev == '\0') && (iVar1 = strcmp(s,"Elbereth"), iVar1 == 0)) {
      exercise(2,'\x01');
    }
    peVar3->engr_time = e_time;
    if (e_type < '\x01') {
      iVar1 = rnd(5);
      e_type = (xchar)iVar1;
    }
    peVar3->engr_type = e_type;
    peVar3->engr_lth = (int)__n + 1;
  }
  return;
}

Assistant:

void make_engr_at(struct level *lev, int x, int y,
		  const char *s, long e_time, xchar e_type)
{
	struct engr *ep;
	size_t engr_len;

	if (!s || !*s)
	    return;

	engr_len = strlen(s);
	if (engr_len > BUFSZ - 1)
	    engr_len = BUFSZ - 1;

	if ((ep = engr_at(lev, x,y)) != 0)
	    del_engr(lev, ep);
	ep = newengr(engr_len + 1);
	memset(ep, 0, sizeof(struct engr) + engr_len + 1);
	ep->nxt_engr = lev->lev_engr;
	lev->lev_engr = ep;
	ep->engr_x = x;
	ep->engr_y = y;
	ep->engr_txt = (char *)(ep + 1);
	strncpy(ep->engr_txt, s, engr_len);
	ep->engr_txt[engr_len] = '\0';
	while (ep->engr_txt[0] == ' ')
	    ep->engr_txt++;
	/* engraving Elbereth shows wisdom */
	if (!in_mklev && !strcmp(s, "Elbereth")) exercise(A_WIS, TRUE);
	ep->engr_time = e_time;
	ep->engr_type = e_type > 0 ? e_type : rnd(N_ENGRAVE-1);
	ep->engr_lth = engr_len + 1;
}